

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.cpp
# Opt level: O2

void __thiscall
ORPG::Core::XMLElement::add_attribute(XMLElement *this,string *name,string *value,int line)

{
  bool bVar1;
  XMLAttribute *pXVar2;
  XMLAttribute *pXVar3;
  string *attrName;
  string *val;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->root == (XMLAttribute *)0x0) {
    pXVar3 = (XMLAttribute *)operator_new(0x50);
    std::__cxx11::string::string((string *)&local_90,(string *)name);
    std::__cxx11::string::string((string *)&local_b0,(string *)value);
    attrName = &local_90;
    val = &local_b0;
    XMLAttribute::XMLAttribute(pXVar3,attrName,val,line);
    this->root = pXVar3;
  }
  else {
    pXVar3 = this->root;
    do {
      pXVar2 = pXVar3;
      std::__cxx11::string::string((string *)&local_50,(string *)pXVar2);
      bVar1 = std::operator!=(&local_50,name);
      std::__cxx11::string::~string((string *)&local_50);
      if (!bVar1) {
        attrName = &local_70;
        std::__cxx11::string::string((string *)attrName,(string *)value);
        std::__cxx11::string::_M_assign((string *)&pXVar2->value);
        goto LAB_001074cd;
      }
      pXVar3 = pXVar2->next;
    } while (pXVar2->next != (XMLAttribute *)0x0);
    pXVar3 = (XMLAttribute *)operator_new(0x50);
    std::__cxx11::string::string((string *)&local_d0,(string *)name);
    std::__cxx11::string::string((string *)&local_f0,(string *)value);
    attrName = &local_d0;
    val = &local_f0;
    XMLAttribute::XMLAttribute(pXVar3,attrName,val,line);
    pXVar2->next = pXVar3;
  }
  std::__cxx11::string::~string((string *)val);
LAB_001074cd:
  std::__cxx11::string::~string((string *)attrName);
  return;
}

Assistant:

void XMLElement::add_attribute(std::string name, std::string value, int line) {
    if(root == nullptr) {
        root = new XMLAttribute(name, value, line);
    } else {
        XMLAttribute* curr = root;
        while(curr != nullptr) {
            if(curr->get_name() != name) {
                // we made it to the end of the attribute list and did not find
                // a match, so lets add it to the list
                if(curr->get_next() == nullptr) {
                    curr->next = new XMLAttribute(name, value, line);
                    break;
                }

                curr = curr->get_next();
            } else {
                // found it
                //TODO(incomingstick): update line number?
                curr->set_value(value);
                break;
            }
        }
    }
}